

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initdsp.c
# Opt level: O0

void flush_display_ptrregion(DLword *ybase,UNSIGNED bitoffset,int w,int h)

{
  uint uVar1;
  uint uVar2;
  int baseoffset;
  int x;
  int y;
  int h_local;
  int w_local;
  UNSIGNED bitoffset_local;
  DLword *ybase_local;
  
  uVar1 = (uint)((long)ybase - (long)DisplayRegion68k >> 1);
  uVar2 = uVar1 / (displaywidth >> 4);
  (*currentdsp->bitblt_to_screen)
            (currentdsp,DisplayRegion68k,
             (int)bitoffset + (uVar1 - (displaywidth >> 4) * uVar2) * 0x10,uVar2,w,h);
  return;
}

Assistant:

void flush_display_ptrregion(DLword *ybase, UNSIGNED bitoffset, int w, int h)
{
  int y, x, baseoffset;
  baseoffset = (((DLword *)ybase) - DisplayRegion68k);
  y = baseoffset / DLWORD_PERLINE;
  x = bitoffset + (BITSPERWORD * (baseoffset - (DLWORD_PERLINE * y)));
  //  printf("flush_display_ptrregion %d %d %d %d\n", x, y, w, h);
#ifdef SDL
  sdl_notify_damage(x, y, w, h);
#endif
#if   (defined(XWINDOW) || defined(DOS))
  TPRINT(("Enter flush_display_ptrregion\n x=%d, y=%d, w=%d, h=%d\n", x, y, w, h));
  (currentdsp->bitblt_to_screen)(currentdsp, DisplayRegion68k, x, y, w, h);
  TPRINT(("Exit flush_display_ptrregion\n"));
#endif /* DOS */
}